

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_IntInsert(Vec_Int_t *vProd,Vec_Int_t *vLevel,int Node,int Level)

{
  int iVar1;
  int iVar2;
  int iHere;
  
  iVar1 = vLevel->nSize;
  do {
    iHere = iVar1;
    if (iHere < 1) break;
    iVar2 = Vec_IntEntry(vLevel,iHere + -1);
    iVar1 = iHere + -1;
  } while (iVar2 < Level);
  Vec_IntInsert(vProd,iHere,Node);
  Vec_IntInsert(vLevel,iHere,Level);
  return;
}

Assistant:

void Wlc_IntInsert( Vec_Int_t * vProd, Vec_Int_t * vLevel, int Node, int Level )
{
    int i;
    for ( i = Vec_IntSize(vLevel) - 1; i >= 0; i-- )
        if ( Vec_IntEntry(vLevel, i) >= Level )
            break;
    Vec_IntInsert( vProd,  i + 1, Node  );
    Vec_IntInsert( vLevel, i + 1, Level );
}